

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder1<fineftp::FtpSession::receiveFile(std::shared_ptr<fineftp::FtpSession::IoFile>)::__0,std::error_code>,asio::detail::binder1<fineftp::FtpSession::receiveFile(std::shared_ptr<fineftp::FtpSession::IoFile>)::__0,std::error_code>>
               (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1294:33),_std::error_code>
                *function,
               binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1294:33),_std::error_code>
               *context)

{
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1294:33),_std::error_code>
  *context_local;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1294:33),_std::error_code>
  *function_local;
  
  asio::detail::
  asio_handler_invoke<asio::detail::binder1<fineftp::FtpSession::receiveFile(std::shared_ptr<fineftp::FtpSession::IoFile>)::__0,std::error_code>,fineftp::FtpSession::receiveFile(std::shared_ptr<fineftp::FtpSession::IoFile>)::__0,std::error_code>
            (function,context);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#elif defined(ASIO_NO_DEPRECATED)
  // The asio_handler_invoke hook is no longer used to invoke the function.
  (void)&error_if_hook_is_defined<Function, Context>;
  (void)context;
  function();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}